

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

void pbrt::AnimatedTransform::FindZeros
               (Float c1,Float c2,Float c3,Float c4,Float c5,Float theta,Interval tInterval,
               span<float> zeros,int *nZeros,int depth)

{
  undefined8 uVar1;
  float fVar2;
  Interval i_00;
  Interval i_01;
  Interval i_02;
  span<float> zeros_00;
  span<float> zeros_01;
  float *pfVar3;
  int in_ECX;
  int *in_RDX;
  Interval in_RSI;
  float *in_RDI;
  Float in_XMM0_Da;
  Float FVar4;
  Float FVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  Float in_XMM1_Da;
  Float in_XMM2_Da;
  Float in_XMM3_Da;
  Float in_XMM4_Da;
  float in_XMM5_Da;
  undefined1 in_ZMM6 [64];
  Float fPrimeNewton;
  Float fNewton;
  int i;
  Float tNewton;
  Float mid;
  Interval dadt;
  Float in_stack_fffffffffffffe18;
  Float in_stack_fffffffffffffe1c;
  float fVar20;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  Float in_stack_fffffffffffffe28;
  Float in_stack_fffffffffffffe2c;
  float fVar21;
  Interval i_03;
  Interval IVar22;
  int local_140;
  float local_13c;
  Interval local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  Interval local_d8;
  Interval local_d0;
  undefined8 local_c8;
  Interval local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  Interval local_a8;
  Interval local_a0;
  undefined8 local_98;
  undefined8 local_90;
  Interval local_88;
  undefined1 local_7c [8];
  undefined8 local_74;
  undefined1 local_6c [8];
  undefined8 local_64;
  undefined8 local_5c;
  Interval local_54;
  undefined8 local_4c;
  Float depth_00;
  Float FVar23;
  Interval local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  
  local_8 = (Interval)vmovlpd_avx(in_ZMM6._0_16_);
  Interval::Interval(&local_54,in_XMM0_Da);
  IVar22 = (Interval)local_6c;
  Interval::Interval((Interval *)IVar22,in_XMM1_Da);
  i_03 = (Interval)local_7c;
  Interval::Interval((Interval *)i_03,in_XMM2_Da);
  local_88 = local_8;
  auVar8._0_8_ = Interval::operator*((Interval *)i_03,IVar22);
  auVar8._8_56_ = extraout_var;
  local_74 = vmovlpd_avx(auVar8._0_16_);
  i_00.high = in_stack_fffffffffffffe2c;
  i_00.low = in_stack_fffffffffffffe28;
  auVar9._0_8_ = Interval::operator+((Interval *)
                                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                                     i_00);
  auVar9._8_56_ = extraout_var_00;
  local_64 = vmovlpd_avx(auVar9._0_16_);
  Interval::Interval(&local_a0,in_XMM5_Da + in_XMM5_Da);
  local_a8 = local_8;
  auVar10._0_8_ = Interval::operator*((Interval *)i_03,IVar22);
  auVar10._8_56_ = extraout_var_01;
  local_98 = vmovlpd_avx(auVar10._0_16_);
  auVar11._0_8_ = Cos(i_03);
  auVar11._8_56_ = extraout_var_02;
  local_90 = vmovlpd_avx(auVar11._0_16_);
  auVar12._0_8_ = Interval::operator*((Interval *)i_03,IVar22);
  auVar12._8_56_ = extraout_var_03;
  local_5c = vmovlpd_avx(auVar12._0_16_);
  i_01.high = in_stack_fffffffffffffe2c;
  i_01.low = in_stack_fffffffffffffe28;
  auVar13._0_8_ =
       Interval::operator+((Interval *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                           ,i_01);
  auVar13._8_56_ = extraout_var_04;
  local_4c = vmovlpd_avx(auVar13._0_16_);
  Interval::Interval(&local_c0,in_XMM3_Da);
  Interval::Interval(&local_d0,in_XMM4_Da);
  local_d8 = local_8;
  auVar14._0_8_ = Interval::operator*((Interval *)i_03,IVar22);
  auVar14._8_56_ = extraout_var_05;
  local_c8 = vmovlpd_avx(auVar14._0_16_);
  i_02.high = in_stack_fffffffffffffe2c;
  i_02.low = in_stack_fffffffffffffe28;
  auVar15._0_8_ =
       Interval::operator+((Interval *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                           ,i_02);
  auVar15._8_56_ = extraout_var_06;
  local_b8 = vmovlpd_avx(auVar15._0_16_);
  Interval::Interval(&local_f0,in_XMM5_Da + in_XMM5_Da);
  auVar16._0_8_ = Interval::operator*((Interval *)i_03,IVar22);
  auVar16._8_56_ = extraout_var_07;
  local_e8 = vmovlpd_avx(auVar16._0_16_);
  auVar17._0_8_ = Sin(i_03);
  auVar17._8_56_ = extraout_var_08;
  local_e0 = vmovlpd_avx(auVar17._0_16_);
  auVar18._0_8_ = Interval::operator*((Interval *)i_03,IVar22);
  auVar18._8_56_ = extraout_var_09;
  local_b0 = vmovlpd_avx(auVar18._0_16_);
  IVar22.high = in_stack_fffffffffffffe2c;
  IVar22.low = in_stack_fffffffffffffe28;
  auVar19._0_8_ =
       Interval::operator+((Interval *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                           ,IVar22);
  auVar19._8_56_ = extraout_var_10;
  uVar1 = vmovlpd_avx(auVar19._0_16_);
  depth_00 = (Float)uVar1;
  FVar23 = (Float)((ulong)uVar1 >> 0x20);
  FVar4 = Interval::LowerBound((Interval *)&stack0xffffffffffffffbc);
  if ((FVar4 <= 0.0) &&
     (FVar4 = Interval::UpperBound((Interval *)&stack0xffffffffffffffbc), 0.0 <= FVar4)) {
    FVar4 = Interval::LowerBound((Interval *)&stack0xffffffffffffffbc);
    FVar5 = Interval::UpperBound((Interval *)&stack0xffffffffffffffbc);
    if ((FVar4 != FVar5) || (NAN(FVar4) || NAN(FVar5))) {
      if ((in_ECX < 1) ||
         (FVar4 = Interval::Width((Interval *)&stack0xffffffffffffffbc), FVar4 <= 0.001)) {
        local_13c = Interval::Midpoint(&local_8);
        for (local_140 = 0; local_140 < 4; local_140 = local_140 + 1) {
          fVar20 = in_XMM1_Da + in_XMM2_Da * local_13c;
          FVar4 = in_XMM0_Da;
          dVar6 = std::cos((double)(ulong)(uint)(in_XMM5_Da * 2.0 * local_13c));
          fVar21 = in_XMM3_Da + in_XMM4_Da * local_13c;
          dVar7 = std::sin((double)(ulong)(uint)(in_XMM5_Da * 2.0 * local_13c));
          fVar20 = in_XMM0_Da + fVar20 * SUB84(dVar6,0) + fVar21 * SUB84(dVar7,0);
          fVar21 = in_XMM2_Da + (in_XMM3_Da + in_XMM4_Da * local_13c) * 2.0 * in_XMM5_Da;
          dVar6 = std::cos((double)(ulong)(uint)(local_13c * 2.0 * in_XMM5_Da));
          fVar2 = in_XMM4_Da - (in_XMM1_Da + in_XMM2_Da * local_13c) * 2.0 * in_XMM5_Da;
          dVar7 = std::sin((double)(ulong)(uint)(local_13c * 2.0 * in_XMM5_Da));
          fVar21 = fVar21 * SUB84(dVar6,0) + fVar2 * SUB84(dVar7,0);
          if (((fVar20 == 0.0) && (!NAN(fVar20))) || ((fVar21 == 0.0 && (!NAN(fVar21))))) break;
          local_13c = local_13c - fVar20 / fVar21;
          in_XMM0_Da = FVar4;
        }
        fVar20 = local_13c;
        FVar4 = Interval::LowerBound(&local_8);
        if ((FVar4 - 0.001 <= fVar20) &&
           (fVar20 = local_13c, FVar4 = Interval::UpperBound(&local_8), fVar20 < FVar4 + 0.001)) {
          pfVar3 = pstd::span<float>::operator[]
                             ((span<float> *)&stack0xffffffffffffffe8,(long)*in_RDX);
          *pfVar3 = local_13c;
          *in_RDX = *in_RDX + 1;
        }
      }
      else {
        Interval::Midpoint(&local_8);
        Interval::LowerBound(&local_8);
        Interval::Interval((Interval *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                           ,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
        zeros_00.ptr._4_4_ = in_XMM0_Da;
        zeros_00.ptr._0_4_ = in_XMM1_Da;
        zeros_00.n = (size_t)in_RDI;
        FindZeros(in_XMM2_Da,in_XMM3_Da,in_XMM4_Da,in_XMM5_Da,(Float)((ulong)in_RDX >> 0x20),
                  SUB84(in_RDX,0),in_RSI,zeros_00,(int *)CONCAT44(in_ECX,FVar23),(int)depth_00);
        Interval::UpperBound(&local_8);
        Interval::Interval((Interval *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                           ,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
        zeros_01.ptr._4_4_ = in_XMM0_Da;
        zeros_01.ptr._0_4_ = in_XMM1_Da;
        zeros_01.n = (size_t)in_RDI;
        FindZeros(in_XMM2_Da,in_XMM3_Da,in_XMM4_Da,in_XMM5_Da,(Float)((ulong)in_RDX >> 0x20),
                  SUB84(in_RDX,0),in_RSI,zeros_01,(int *)CONCAT44(in_ECX,FVar23),(int)depth_00);
      }
    }
  }
  return;
}

Assistant:

PBRT_CPU_GPU void AnimatedTransform::FindZeros(Float c1, Float c2, Float c3, Float c4, Float c5,
                                  Float theta, Interval tInterval,
                                  pstd::span<Float> zeros, int *nZeros, int depth) {
    // Evaluate motion derivative in interval form, return if no zeros
    Interval dadt =
        Interval(c1) +
        (Interval(c2) + Interval(c3) * tInterval) * Cos(Interval(2 * theta) * tInterval) +
        (Interval(c4) + Interval(c5) * tInterval) * Sin(Interval(2 * theta) * tInterval);
    if (dadt.LowerBound() > 0 || dadt.UpperBound() < 0 ||
        dadt.LowerBound() == dadt.UpperBound())
        return;

    // Either split range and recurse or report a zero
    if (depth > 0 && dadt.Width() > 1e-3) {
        // Split _tInterval_ and check both resulting intervals
        Float mid = tInterval.Midpoint();
        FindZeros(c1, c2, c3, c4, c5, theta, Interval(tInterval.LowerBound(), mid), zeros,
                  nZeros, depth - 1);
        FindZeros(c1, c2, c3, c4, c5, theta, Interval(mid, tInterval.UpperBound()), zeros,
                  nZeros, depth - 1);

    } else {
        // Use Newton's method to refine zero
        Float tNewton = tInterval.Midpoint();
        for (int i = 0; i < 4; ++i) {
            // Evaluate motion function derivative and its derivative at _tNewton_
            Float fNewton = c1 + (c2 + c3 * tNewton) * std::cos(2 * theta * tNewton) +
                            (c4 + c5 * tNewton) * std::sin(2 * theta * tNewton);
            Float fPrimeNewton =
                (c3 + 2 * (c4 + c5 * tNewton) * theta) * std::cos(2 * tNewton * theta) +
                (c5 - 2 * (c2 + c3 * tNewton) * theta) * std::sin(2 * tNewton * theta);

            if (fNewton == 0 || fPrimeNewton == 0)
                break;
            tNewton = tNewton - fNewton / fPrimeNewton;
        }

        // Record zero if refined zero is in interval
        if (tNewton >= tInterval.LowerBound() - 1e-3f &&
            tNewton < tInterval.UpperBound() + 1e-3f) {
            zeros[*nZeros] = tNewton;
            (*nZeros)++;
        }
    }
}